

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QUnifiedTimer::~QUnifiedTimer(QUnifiedTimer *this)

{
  *(undefined ***)this = &PTR_metaObject_006678e8;
  QArrayDataPointer<QAbstractAnimationTimer_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractAnimationTimer_*> *)(this + 0xa0));
  QArrayDataPointer<QAbstractAnimationTimer_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractAnimationTimer_*> *)(this + 0x88));
  QArrayDataPointer<QAbstractAnimationTimer_*>::~QArrayDataPointer
            ((QArrayDataPointer<QAbstractAnimationTimer_*> *)(this + 0x70));
  QBasicTimer::~QBasicTimer((QBasicTimer *)(this + 0x38));
  QDefaultAnimationDriver::~QDefaultAnimationDriver((QDefaultAnimationDriver *)(this + 0x18));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QUnifiedTimer::~QUnifiedTimer()
    = default;